

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O3

void __thiscall coins_tests::ccoins_spend::test_method(ccoins_spend *this)

{
  long lVar1;
  char in_R9B;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CheckSpendCoins((coins_tests *)0xfffffffffffffffe,-2,-2,0xffffffff,-1,in_R9B);
  CheckSpendCoins((coins_tests *)0xfffffffffffffffe,-1,-1,0,'\x01',in_R9B);
  CheckSpendCoins((coins_tests *)0xfffffffffffffffe,-1,-2,2,-1,in_R9B);
  CheckSpendCoins((coins_tests *)0xfffffffffffffffe,-1,-1,1,'\x01',in_R9B);
  CheckSpendCoins((coins_tests *)0xfffffffffffffffe,-1,-2,3,-1,in_R9B);
  CheckSpendCoins((coins_tests *)0xfffffffffffffffe,200,-1,0,'\x01',in_R9B);
  CheckSpendCoins((coins_tests *)0xfffffffffffffffe,200,-2,2,-1,in_R9B);
  CheckSpendCoins((coins_tests *)0xfffffffffffffffe,200,-1,1,'\x01',in_R9B);
  CheckSpendCoins((coins_tests *)0xfffffffffffffffe,200,-2,3,-1,in_R9B);
  CheckSpendCoins((coins_tests *)0xffffffffffffffff,-2,-2,0xffffffff,-1,in_R9B);
  CheckSpendCoins((coins_tests *)0xffffffffffffffff,-1,-1,0,'\x01',in_R9B);
  CheckSpendCoins((coins_tests *)0xffffffffffffffff,-1,-2,2,-1,in_R9B);
  CheckSpendCoins((coins_tests *)0xffffffffffffffff,-1,-1,1,'\x01',in_R9B);
  CheckSpendCoins((coins_tests *)0xffffffffffffffff,-1,-2,3,-1,in_R9B);
  CheckSpendCoins((coins_tests *)0xffffffffffffffff,200,-1,0,'\x01',in_R9B);
  CheckSpendCoins((coins_tests *)0xffffffffffffffff,200,-2,2,-1,in_R9B);
  CheckSpendCoins((coins_tests *)0xffffffffffffffff,200,-1,1,'\x01',in_R9B);
  CheckSpendCoins((coins_tests *)0xffffffffffffffff,200,-2,3,-1,in_R9B);
  CheckSpendCoins((coins_tests *)0x64,-2,-1,0xffffffff,'\x01',in_R9B);
  CheckSpendCoins((coins_tests *)0x64,-1,-1,0,'\x01',in_R9B);
  CheckSpendCoins((coins_tests *)0x64,-1,-2,2,-1,in_R9B);
  CheckSpendCoins((coins_tests *)0x64,-1,-1,1,'\x01',in_R9B);
  CheckSpendCoins((coins_tests *)0x64,-1,-2,3,-1,in_R9B);
  CheckSpendCoins((coins_tests *)0x64,200,-1,0,'\x01',in_R9B);
  CheckSpendCoins((coins_tests *)0x64,200,-2,2,-1,in_R9B);
  CheckSpendCoins((coins_tests *)0x64,200,-1,1,'\x01',in_R9B);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    CheckSpendCoins((coins_tests *)0x64,200,-2,3,-1,in_R9B);
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ccoins_spend)
{
    /* Check SpendCoin behavior, requesting a coin from a cache view layered on
     * top of a base view, spending, and then checking
     * the resulting entry in the cache after the modification.
     *
     *              Base    Cache   Result  Cache        Result
     *              Value   Value   Value   Flags        Flags
     */
    CheckSpendCoins(ABSENT, ABSENT, ABSENT, NO_ENTRY   , NO_ENTRY   );
    CheckSpendCoins(ABSENT, SPENT , SPENT , 0          , DIRTY      );
    CheckSpendCoins(ABSENT, SPENT , ABSENT, FRESH      , NO_ENTRY   );
    CheckSpendCoins(ABSENT, SPENT , SPENT , DIRTY      , DIRTY      );
    CheckSpendCoins(ABSENT, SPENT , ABSENT, DIRTY|FRESH, NO_ENTRY   );
    CheckSpendCoins(ABSENT, VALUE2, SPENT , 0          , DIRTY      );
    CheckSpendCoins(ABSENT, VALUE2, ABSENT, FRESH      , NO_ENTRY   );
    CheckSpendCoins(ABSENT, VALUE2, SPENT , DIRTY      , DIRTY      );
    CheckSpendCoins(ABSENT, VALUE2, ABSENT, DIRTY|FRESH, NO_ENTRY   );
    CheckSpendCoins(SPENT , ABSENT, ABSENT, NO_ENTRY   , NO_ENTRY   );
    CheckSpendCoins(SPENT , SPENT , SPENT , 0          , DIRTY      );
    CheckSpendCoins(SPENT , SPENT , ABSENT, FRESH      , NO_ENTRY   );
    CheckSpendCoins(SPENT , SPENT , SPENT , DIRTY      , DIRTY      );
    CheckSpendCoins(SPENT , SPENT , ABSENT, DIRTY|FRESH, NO_ENTRY   );
    CheckSpendCoins(SPENT , VALUE2, SPENT , 0          , DIRTY      );
    CheckSpendCoins(SPENT , VALUE2, ABSENT, FRESH      , NO_ENTRY   );
    CheckSpendCoins(SPENT , VALUE2, SPENT , DIRTY      , DIRTY      );
    CheckSpendCoins(SPENT , VALUE2, ABSENT, DIRTY|FRESH, NO_ENTRY   );
    CheckSpendCoins(VALUE1, ABSENT, SPENT , NO_ENTRY   , DIRTY      );
    CheckSpendCoins(VALUE1, SPENT , SPENT , 0          , DIRTY      );
    CheckSpendCoins(VALUE1, SPENT , ABSENT, FRESH      , NO_ENTRY   );
    CheckSpendCoins(VALUE1, SPENT , SPENT , DIRTY      , DIRTY      );
    CheckSpendCoins(VALUE1, SPENT , ABSENT, DIRTY|FRESH, NO_ENTRY   );
    CheckSpendCoins(VALUE1, VALUE2, SPENT , 0          , DIRTY      );
    CheckSpendCoins(VALUE1, VALUE2, ABSENT, FRESH      , NO_ENTRY   );
    CheckSpendCoins(VALUE1, VALUE2, SPENT , DIRTY      , DIRTY      );
    CheckSpendCoins(VALUE1, VALUE2, ABSENT, DIRTY|FRESH, NO_ENTRY   );
}